

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h2h3.c
# Opt level: O1

CURLcode Curl_pseudo_headers(Curl_easy *data,char *mem,size_t len,h2h3req **hp)

{
  char **ppcVar1;
  char cVar2;
  connectdata *pcVar3;
  size_t sVar4;
  size_t sVar5;
  h2h3req *phVar6;
  CURLcode CVar7;
  int iVar8;
  ulong uVar9;
  h2h3req *phVar10;
  char *pcVar11;
  void *pvVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  size_t sVar19;
  char *pcVar20;
  size_t *psVar21;
  ulong uVar22;
  size_t sVar23;
  char cVar24;
  h2h3pseudo authority;
  ulong local_70;
  
  if (len < 2) {
    uVar22 = 0;
  }
  else {
    uVar9 = 1;
    uVar22 = 0;
    do {
      if ((mem[uVar9] == '\n') && (mem[uVar9 - 1] == '\r')) {
        uVar22 = uVar22 + 1;
        uVar9 = uVar9 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < len);
  }
  if (1 < uVar22) {
    pcVar3 = data->conn;
    phVar10 = (h2h3req *)(*Curl_cmalloc)(uVar22 * 0x20 + 0x28);
    if (phVar10 != (h2h3req *)0x0) {
      pcVar11 = (char *)memchr(mem,0xd,len);
      if (pcVar11 != (char *)0x0) {
        pvVar12 = memchr(mem,0x20,(long)pcVar11 - (long)mem);
        if ((long)pvVar12 - (long)mem != 0 && pvVar12 != (void *)0x0) {
          phVar10->header[0].name = ":method";
          phVar10->header[0].namelen = 7;
          phVar10->header[0].value = mem;
          phVar10->header[0].valuelen = (long)pvVar12 - (long)mem;
          sVar19 = (long)pvVar12 + 1;
          lVar18 = 0;
          for (lVar16 = (long)pcVar11 - sVar19; lVar16 != 0; lVar16 = lVar16 + -1) {
            if (*(char *)((long)pvVar12 + lVar16) == ' ') {
              lVar18 = (long)pvVar12 + lVar16;
              break;
            }
          }
          if ((char *)(lVar18 - sVar19) != (char *)0x0 && lVar18 != 0) {
            sVar23 = uVar22 + 1;
            phVar10[1].entries = (size_t)":path";
            phVar10[1].header[0].name = (char *)0x5;
            phVar10[1].header[0].namelen = sVar19;
            phVar10[1].header[0].value = (char *)(lVar18 - sVar19);
            phVar10[1].header[0].valuelen = (size_t)":scheme";
            phVar10[2].entries = 7;
            pcVar13 = Curl_checkheaders(data,":scheme",7);
            if (pcVar13 == (char *)0x0) {
              if ((pcVar3->handler->flags & 1) == 0) {
                pcVar13 = "http";
              }
              else {
                pcVar13 = "https";
              }
              phVar10[2].header[0].name = pcVar13;
            }
            else {
              for (pcVar13 = pcVar13 + 8; (*pcVar13 == ' ' || (*pcVar13 == '\t'));
                  pcVar13 = pcVar13 + 1) {
              }
              phVar10[2].header[0].name = pcVar13;
              Curl_infof(data,"set pseudo header %s to %s",":scheme",pcVar13);
            }
            sVar14 = strlen(phVar10[2].header[0].name);
            phVar10[2].header[0].namelen = sVar14;
            if (sVar23 < 4) {
              local_70 = 0;
            }
            else {
              uVar22 = 3;
              local_70 = 0;
              do {
                pcVar13 = pcVar11 + 2;
                pcVar15 = (char *)memchr(pcVar13,0xd,(size_t)(mem + (len - (long)pcVar13)));
                CVar7 = CURLE_COULDNT_RESOLVE_PROXY;
                if (((pcVar15 != pcVar13 && pcVar15 != (char *)0x0) && (*pcVar13 != '\t')) &&
                   (*pcVar13 != ' ')) {
                  lVar18 = 2;
                  pcVar20 = pcVar13;
                  lVar16 = lVar18;
                  if (pcVar13 < pcVar15) {
                    lVar16 = (long)pcVar15 - (long)pcVar11;
                    do {
                      if (pcVar11[lVar18] == ':') {
                        pcVar20 = pcVar11 + lVar18;
                        lVar16 = lVar18;
                        break;
                      }
                      lVar18 = lVar18 + 1;
                      pcVar20 = pcVar15;
                    } while (lVar16 != lVar18);
                  }
                  CVar7 = CURLE_COULDNT_RESOLVE_PROXY;
                  if (pcVar20 != pcVar15 && lVar16 != 2) {
                    sVar19 = lVar16 - 2;
                    if ((sVar19 == 4) &&
                       (iVar8 = Curl_strncasecompare("host",pcVar13,4), iVar8 != 0)) {
                      phVar10->header[uVar22].name = ":authority";
                      phVar10->header[uVar22].namelen = 10;
                      local_70 = uVar22;
                    }
                    else {
                      phVar10->header[uVar22].namelen = sVar19;
                      Curl_strntolower(pcVar13,pcVar13,sVar19);
                      phVar10->header[uVar22].name = pcVar13;
                    }
                    pcVar11 = pcVar15 + ~(ulong)pcVar20;
                    while( true ) {
                      pcVar20 = pcVar20 + 1;
                      if ((*pcVar20 != ' ') && (*pcVar20 != '\t')) break;
                      pcVar11 = pcVar11 + -1;
                    }
                    pcVar13 = phVar10->header[uVar22].name;
                    sVar19 = phVar10->header[uVar22].namelen;
                    cVar24 = '\0';
                    if ((long)sVar19 < 10) {
                      if (sVar19 == 2) {
                        iVar8 = Curl_strncasecompare("te",pcVar13,2);
                        pcVar13 = pcVar20;
                        pcVar17 = pcVar20;
                        if (iVar8 != 0) {
                          while( true ) {
                            for (; (pcVar13 != pcVar15 &&
                                   ((*pcVar13 == ' ' || (pcVar17 = pcVar13, *pcVar13 == '\t'))));
                                pcVar13 = pcVar13 + 1) {
                              pcVar17 = pcVar15;
                            }
                            if ((pcVar13 == pcVar15) || ((ulong)((long)pcVar15 - (long)pcVar17) < 8)
                               ) break;
                            iVar8 = Curl_strncasecompare("trailers",pcVar17,8);
                            if (iVar8 != 0) {
                              pcVar17 = pcVar17 + 8;
                              cVar24 = '\x02';
                              while( true ) {
                                if (pcVar17 == pcVar15) goto LAB_005147f5;
                                cVar2 = *pcVar17;
                                if ((cVar2 != ' ') && (cVar2 != '\t')) break;
                                pcVar17 = pcVar17 + 1;
                              }
                              if (pcVar17 == pcVar15 || cVar2 == ',') goto LAB_005147f5;
                            }
                            if (pcVar17 == pcVar15) break;
                            cVar24 = *pcVar17;
                            while (cVar24 != ',') {
                              pcVar17 = pcVar17 + 1;
                              if (pcVar17 == pcVar15) goto LAB_005147f0;
                              cVar24 = *pcVar17;
                            }
                            pcVar13 = pcVar17 + 1;
                            pcVar17 = pcVar17 + 1;
                          }
LAB_005147f0:
                          cVar24 = '\x01';
                        }
                      }
                      else if (sVar19 == 7) {
                        sVar19 = 7;
                        pcVar17 = "upgrade";
                        goto LAB_005146cc;
                      }
                    }
                    else if (sVar19 == 10) {
                      iVar8 = Curl_strncasecompare("connection",pcVar13,10);
                      cVar24 = '\x01';
                      if (iVar8 == 0) {
                        sVar19 = 10;
                        pcVar17 = "keep-alive";
LAB_005146cc:
                        iVar8 = Curl_strncasecompare(pcVar17,pcVar13,sVar19);
                        cVar24 = iVar8 != 0;
                      }
                    }
                    else if (sVar19 == 0x10) {
                      iVar8 = Curl_strncasecompare("proxy-connection",pcVar13,0x10);
                      cVar24 = iVar8 != 0;
                    }
                    else if (sVar19 == 0x11) {
                      sVar19 = 0x11;
                      pcVar17 = "transfer-encoding";
                      goto LAB_005146cc;
                    }
LAB_005147f5:
                    if (cVar24 == '\x02') {
                      pcVar11 = (char *)0x8;
                      pcVar20 = "trailers";
                    }
                    else if (cVar24 == '\x01') {
                      sVar23 = sVar23 - 1;
                      CVar7 = CURLE_FTP_WEIRD_PASS_REPLY;
                      goto LAB_00514840;
                    }
                    phVar10->header[uVar22].value = pcVar20;
                    phVar10->header[uVar22].valuelen = (size_t)pcVar11;
                    uVar22 = uVar22 + 1;
                    CVar7 = CURLE_OK;
                  }
                }
LAB_00514840:
                if ((CVar7 != CURLE_OK) && (CVar7 != CURLE_FTP_WEIRD_PASS_REPLY)) {
                  if (CVar7 != CURLE_COULDNT_RESOLVE_PROXY) {
                    return CVar7;
                  }
                  goto LAB_005143f0;
                }
                pcVar11 = pcVar15;
              } while (uVar22 < sVar23);
            }
            if ((local_70 != 0) && (local_70 != 3)) {
              pcVar11 = phVar10->header[local_70].name;
              sVar19 = phVar10->header[local_70].namelen;
              ppcVar1 = &phVar10->header[local_70].value;
              pcVar13 = *ppcVar1;
              sVar4 = (size_t)ppcVar1[1];
              if (3 < local_70) {
                memmove(&phVar10[3].header[0].namelen,&phVar10[2].header[0].value,
                        local_70 * 0x20 - 0x60);
                local_70 = 3;
              }
              ppcVar1 = &phVar10->header[local_70].value;
              *ppcVar1 = pcVar13;
              ppcVar1[1] = (char *)sVar4;
              phVar10->header[local_70].name = pcVar11;
              phVar10->header[local_70].namelen = sVar19;
            }
            if (sVar23 != 0) {
              uVar22 = 0;
              sVar19 = sVar23;
              phVar6 = phVar10;
              do {
                psVar21 = &phVar6->header[0].valuelen;
                sVar4 = phVar6->header[0].namelen;
                sVar5 = *psVar21;
                uVar22 = uVar22 + sVar4 + sVar5;
                Curl_infof(data,"h2h3 [%.*s: %.*s]",sVar4,phVar6->header[0].name,sVar5,
                           phVar6->header[0].value);
                sVar19 = sVar19 - 1;
                phVar6 = (h2h3req *)psVar21;
              } while (sVar19 != 0);
              if (60000 < uVar22) {
                Curl_infof(data,
                           "http_request: Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                           ,60000);
              }
            }
            phVar10->entries = sVar23;
            *hp = phVar10;
            return CURLE_OK;
          }
        }
      }
      goto LAB_005143f0;
    }
  }
  phVar10 = (h2h3req *)0x0;
LAB_005143f0:
  (*Curl_cfree)(phVar10);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pseudo_headers(struct Curl_easy *data,
                             const char *mem, /* the request */
                             const size_t len /* size of request */,
                             struct h2h3req **hp)
{
  struct connectdata *conn = data->conn;
  size_t nheader = 0;
  size_t i;
  size_t authority_idx;
  char *hdbuf = (char *)mem;
  char *end, *line_end;
  struct h2h3pseudo *nva = NULL;
  struct h2h3req *hreq = NULL;
  char *vptr;

  /* Calculate number of headers contained in [mem, mem + len). Assumes a
     correctly generated HTTP header field block. */
  for(i = 1; i < len; ++i) {
    if(hdbuf[i] == '\n' && hdbuf[i - 1] == '\r') {
      ++nheader;
      ++i;
    }
  }
  if(nheader < 2) {
    goto fail;
  }
  /* We counted additional 2 \r\n in the first and last line. We need 3
     new headers: :method, :path and :scheme. Therefore we need one
     more space. */
  nheader += 1;
  hreq = malloc(sizeof(struct h2h3req) +
                sizeof(struct h2h3pseudo) * (nheader - 1));
  if(!hreq) {
    goto fail;
  }

  nva = &hreq->header[0];

  /* Extract :method, :path from request line
     We do line endings with CRLF so checking for CR is enough */
  line_end = memchr(hdbuf, '\r', len);
  if(!line_end) {
    goto fail;
  }

  /* Method does not contain spaces */
  end = memchr(hdbuf, ' ', line_end - hdbuf);
  if(!end || end == hdbuf)
    goto fail;
  nva[0].name = H2H3_PSEUDO_METHOD;
  nva[0].namelen = sizeof(H2H3_PSEUDO_METHOD) - 1;
  nva[0].value = hdbuf;
  nva[0].valuelen = (size_t)(end - hdbuf);

  hdbuf = end + 1;

  /* Path may contain spaces so scan backwards */
  end = NULL;
  for(i = (size_t)(line_end - hdbuf); i; --i) {
    if(hdbuf[i - 1] == ' ') {
      end = &hdbuf[i - 1];
      break;
    }
  }
  if(!end || end == hdbuf)
    goto fail;
  nva[1].name = H2H3_PSEUDO_PATH;
  nva[1].namelen = sizeof(H2H3_PSEUDO_PATH) - 1;
  nva[1].value = hdbuf;
  nva[1].valuelen = (end - hdbuf);

  nva[2].name = H2H3_PSEUDO_SCHEME;
  nva[2].namelen = sizeof(H2H3_PSEUDO_SCHEME) - 1;
  vptr = Curl_checkheaders(data, STRCONST(H2H3_PSEUDO_SCHEME));
  if(vptr) {
    vptr += sizeof(H2H3_PSEUDO_SCHEME);
    while(*vptr && ISBLANK(*vptr))
      vptr++;
    nva[2].value = vptr;
    infof(data, "set pseudo header %s to %s", H2H3_PSEUDO_SCHEME, vptr);
  }
  else {
    if(conn->handler->flags & PROTOPT_SSL)
      nva[2].value = "https";
    else
      nva[2].value = "http";
  }
  nva[2].valuelen = strlen((char *)nva[2].value);

  authority_idx = 0;
  i = 3;
  while(i < nheader) {
    size_t hlen;

    hdbuf = line_end + 2;

    /* check for next CR, but only within the piece of data left in the given
       buffer */
    line_end = memchr(hdbuf, '\r', len - (hdbuf - (char *)mem));
    if(!line_end || (line_end == hdbuf))
      goto fail;

    /* header continuation lines are not supported */
    if(*hdbuf == ' ' || *hdbuf == '\t')
      goto fail;

    for(end = hdbuf; end < line_end && *end != ':'; ++end)
      ;
    if(end == hdbuf || end == line_end)
      goto fail;
    hlen = end - hdbuf;

    if(hlen == 4 && strncasecompare("host", hdbuf, 4)) {
      authority_idx = i;
      nva[i].name = H2H3_PSEUDO_AUTHORITY;
      nva[i].namelen = sizeof(H2H3_PSEUDO_AUTHORITY) - 1;
    }
    else {
      nva[i].namelen = (size_t)(end - hdbuf);
      /* Lower case the header name for HTTP/3 */
      Curl_strntolower((char *)hdbuf, hdbuf, nva[i].namelen);
      nva[i].name = hdbuf;
    }
    hdbuf = end + 1;
    while(*hdbuf == ' ' || *hdbuf == '\t')
      ++hdbuf;
    end = line_end;

    switch(inspect_header((const char *)nva[i].name, nva[i].namelen, hdbuf,
                          end - hdbuf)) {
    case HEADERINST_IGNORE:
      /* skip header fields prohibited by HTTP/2 specification. */
      --nheader;
      continue;
    case HEADERINST_TE_TRAILERS:
      nva[i].value = "trailers";
      nva[i].valuelen = sizeof("trailers") - 1;
      break;
    default:
      nva[i].value = hdbuf;
      nva[i].valuelen = (end - hdbuf);
    }

    ++i;
  }

  /* :authority must come before non-pseudo header fields */
  if(authority_idx && authority_idx != AUTHORITY_DST_IDX) {
    struct h2h3pseudo authority = nva[authority_idx];
    for(i = authority_idx; i > AUTHORITY_DST_IDX; --i) {
      nva[i] = nva[i - 1];
    }
    nva[i] = authority;
  }

  /* Warn stream may be rejected if cumulative length of headers is too
     large. */
#define MAX_ACC 60000  /* <64KB to account for some overhead */
  {
    size_t acc = 0;

    for(i = 0; i < nheader; ++i) {
      acc += nva[i].namelen + nva[i].valuelen;

      infof(data, "h2h3 [%.*s: %.*s]",
            (int)nva[i].namelen, nva[i].name,
            (int)nva[i].valuelen, nva[i].value);
    }

    if(acc > MAX_ACC) {
      infof(data, "http_request: Warning: The cumulative length of all "
            "headers exceeds %d bytes and that could cause the "
            "stream to be rejected.", MAX_ACC);
    }
  }

  hreq->entries = nheader;
  *hp = hreq;

  return CURLE_OK;

  fail:
  free(hreq);
  return CURLE_OUT_OF_MEMORY;
}